

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtol.c
# Opt level: O0

long strtol(char *__nptr,char **__endptr,int __base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char *local_50;
  char **local_48;
  char **local_40;
  char *p;
  char *pcStack_30;
  char sign;
  long rc;
  char **ppcStack_20;
  int base_local;
  char **endptr_local;
  char *s_local;
  
  p._7_1_ = '+';
  rc._4_4_ = __base;
  ppcStack_20 = __endptr;
  endptr_local = (char **)__nptr;
  local_40 = (char **)_PDCLIB_strtox_prelim(__nptr,(char *)((long)&p + 7),(int *)((long)&rc + 4));
  if (((int)rc._4_4_ < 2) || (0x24 < (int)rc._4_4_)) {
    s_local = (char *)0x0;
  }
  else {
    if (p._7_1_ == '+') {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
      pcStack_30 = (char *)_PDCLIB_strtox_main((char **)&local_40,rc._4_4_,0x7fffffffffffffff,
                                               SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff))
                                                      / SEXT816((long)(int)rc._4_4_),0),
                                               SUB164((auVar2 << 0x40 | ZEXT816(0x7fffffffffffffff))
                                                      % SEXT816((long)(int)rc._4_4_),0),
                                               (char *)((long)&p + 7));
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
      pcStack_30 = (char *)_PDCLIB_strtox_main((char **)&local_40,rc._4_4_,0x8000000000000000,
                                               SUB168((auVar3 << 0x40 | ZEXT816(0x8000000000000000))
                                                      / SEXT816((long)(int)-rc._4_4_),0),
                                               -SUB164((auVar4 << 0x40 | ZEXT816(0x8000000000000000)
                                                       ) % SEXT816((long)(int)rc._4_4_),0),
                                               (char *)((long)&p + 7));
    }
    if (ppcStack_20 != (char **)0x0) {
      if (local_40 == (char **)0x0) {
        local_48 = endptr_local;
      }
      else {
        local_48 = local_40;
      }
      *ppcStack_20 = (char *)local_48;
    }
    if (p._7_1_ == '+') {
      local_50 = pcStack_30;
    }
    else {
      local_50 = (char *)-(long)pcStack_30;
    }
    s_local = local_50;
  }
  return (long)s_local;
}

Assistant:

long int strtol( const char * s, char ** endptr, int base )
{
    long int rc;
    char sign = '+';
    const char * p = _PDCLIB_strtox_prelim( s, &sign, &base );

    if ( base < 2 || base > 36 )
    {
        return 0;
    }

    if ( sign == '+' )
    {
        rc = ( long int )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )LONG_MAX, ( uintmax_t )( LONG_MAX / base ), ( int )( LONG_MAX % base ), &sign );
    }
    else
    {
        rc = ( long int )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )LONG_MIN, ( uintmax_t )( LONG_MIN / -base ), ( int )( -( LONG_MIN % base ) ), &sign );
    }

    if ( endptr != NULL )
    {
        *endptr = ( p != NULL ) ? ( char * ) p : ( char * ) s;
    }

    return ( sign == '+' ) ? rc : -rc;
}